

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O1

ulong tidyOptGetDefaultInt(TidyOption topt)

{
  if ((topt == (TidyOption)0x0) || (topt[4]._opaque == 0)) {
    if (topt->_opaque != 0xd) {
      return 0xffffffff;
    }
    topt = (TidyOption)prvTidygetOption(TidyDoctypeMode);
  }
  return ((TidyOptionImpl *)topt)->dflt;
}

Assistant:

ulong TIDY_CALL          tidyOptGetDefaultInt( TidyOption topt )
{
    const TidyOptionImpl* option = tidyOptionToImpl( topt );
    if ( option && option->type != TidyString )
        return option->dflt;

    /* Special case for TidyDoctype, because it has a picklist */
    if ( option->id == TidyDoctype )
    {
        const TidyOptionImpl* newopt = TY_(getOption)( TidyDoctypeMode );
        return newopt->dflt;
    }

    return ~0U;
}